

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fp8.cpp
# Opt level: O0

float __thiscall MILBlob::Fp8E4M3FN::GetFloat(Fp8E4M3FN *this)

{
  uint uVar1;
  FloatCast local_1c;
  Fp8E4M3FN *pFStack_18;
  FloatCast fp32;
  Fp8E4M3FN *this_local;
  
  pFStack_18 = this;
  memset(&local_1c,0,4);
  uVar1 = (uint)((this->data).byte >> 7) << 0x1f;
  local_1c.bytes = local_1c.bytes & 0x7fffffff | uVar1;
  if ((((this->data).byte >> 3 & 0xf) == 0xf) && (((this->data).byte & 7) == 7)) {
    this_local._4_4_ = uVar1 | 0x7f800000 | (uint)((this->data).byte & 7);
  }
  else {
    HandleFp8ToFp32ExponentMantissa<MILBlob::Fp8E4M3FN,MILBlob::Fp8E4M3FN::Cast>
              (&this->data,&local_1c);
    HandleFp8ToFp32Denormalize<MILBlob::Fp8E4M3FN::Cast_const>(&this->data,&local_1c);
    this_local._4_4_ = local_1c.f;
  }
  return this_local._4_4_;
}

Assistant:

float Fp8E4M3FN::GetFloat() const
{
    FloatCast fp32 = {.f = 0};
    // Set the sign bit.
    fp32.components.sign = data.components.sign;
    // NaN case, infinity is not supported. We just use the mantissa from the fp8.
    if (data.components.exponent == (0x1 << fp8ExponentBits) - 1 && data.components.mantissa == 0x7) {
        fp32.components.exponent = 0xFF;
        fp32.components.mantissa = data.components.mantissa;
        return fp32.f;
    }
    HandleFp8ToFp32ExponentMantissa<Fp8E4M3FN, Fp8E4M3FN::Cast>(data, fp32);
    HandleFp8ToFp32Denormalize(data, fp32);
    return fp32.f;
}